

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O0

void __thiscall Object::anglePostCheck(Object *this,Vector2d *obs)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RDI;
  Vector3d pt;
  int i;
  Edge new_edge;
  int pop_cnt;
  bool break_judge;
  int id;
  int size_1;
  double front_angle;
  Edge *eg;
  size_t j;
  size_t max_size;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_ffffffffffffff08;
  value_type *in_stack_ffffffffffffff18;
  Edge *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  double in_stack_ffffffffffffff30;
  Edge *in_stack_ffffffffffffff38;
  int local_a4;
  int local_38;
  size_type local_20;
  
  sVar4 = std::vector<Edge,_std::allocator<Edge>_>::size
                    ((vector<Edge,_std::allocator<Edge>_> *)
                     &(in_RDI->
                      super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      )._M_impl.super__Deque_impl_data._M_start);
  local_20 = 0;
  do {
    if (sVar4 <= local_20) {
      return;
    }
    std::vector<Edge,_std::allocator<Edge>_>::operator[]
              ((vector<Edge,_std::allocator<Edge>_> *)
               &(in_RDI->
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Deque_impl_data._M_start,local_20);
    sVar5 = std::
            deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::size((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)0x14c8c2);
    if (3 < sVar5) {
      std::
      deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::front(&in_stack_ffffffffffffff20->
               super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             );
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::z
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)0x14c8e2);
      sVar5 = std::
              deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::size((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)0x14c8fc);
      iVar3 = (int)sVar5 + -1;
      bVar1 = false;
      for (local_38 = 2; local_38 < iVar3; local_38 = local_38 + 1) {
        bVar2 = Edge::angleInRange(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                                   in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
        if (bVar2) {
          bVar1 = true;
          break;
        }
      }
      if (bVar1) {
        Edge::Edge(in_stack_ffffffffffffff20);
        for (local_a4 = 0; local_a4 < iVar3 - local_38; local_a4 = local_a4 + 1) {
          std::
          deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::back(&in_stack_ffffffffffffff20->
                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                );
          Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                    ((Matrix<double,_3,_1,_0,_3,_1> *)in_RDI,in_stack_ffffffffffffff08);
          std::
          deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::pop_back(in_RDI);
          std::
          deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
          emplace_front<Eigen::Matrix<double,3,1,0,3,1>&>(in_RDI,in_stack_ffffffffffffff08);
        }
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::back(&in_stack_ffffffffffffff20->
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              );
        std::deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::emplace_front<Eigen::Matrix<double,3,1,0,3,1>&>(in_RDI,in_stack_ffffffffffffff08);
        Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
                  ((Matrix<double,_2,_1,_0,_2,_1> *)in_RDI,
                   (Matrix<double,_2,_1,_0,_2,_1> *)in_stack_ffffffffffffff08);
        Edge::initWithObs(eg,(Vector2d *)front_angle);
        std::vector<Edge,_std::allocator<Edge>_>::push_back
                  ((vector<Edge,_std::allocator<Edge>_> *)in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff18);
        Edge::~Edge((Edge *)0x14ca89);
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void Object::anglePostCheck(const Eigen::Vector2d& obs) {
    size_t max_size = edges.size();
    for (size_t j = 0; j < max_size; j++) {
        Edge& eg = edges[j];
        if (eg.size() < 4) continue;
        double front_angle = eg.front().z();
        int size_1 = static_cast<int>(eg.size()) - 1, id = 2;
        bool break_judge = false;
        for (; id < size_1; id++) {
            if (eg.angleInRange(front_angle, id, id + 1) == false) continue;
            break_judge = true;
            break;
        }
        if (break_judge == false) continue;
        int pop_cnt = size_1 - id;
        Edge new_edge;
        for (int i = 0; i < pop_cnt; i++) {
            Eigen::Vector3d pt = eg.back();
            eg.pop_back();
            new_edge.emplace_front(pt);
        }
        new_edge.emplace_front(eg.back());
        new_edge.initWithObs(obs);
        edges.push_back(new_edge);
    }
}